

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O3

void __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Release(ShardedLRUCache *this,Handle *handle)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  Mutex *__mutex;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(uint *)(handle + 0x40);
  __mutex = &this->shard_[uVar1 >> 0x1c].mutex_;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    LRUCache::Unref(this->shard_ + (uVar1 >> 0x1c),(LRUHandle *)handle);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    uVar4 = std::__throw_system_error(iVar3);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Unwind_Resume(uVar4);
    }
  }
  __stack_chk_fail();
}

Assistant:

void Release(Handle* handle) override {
    LRUHandle* h = reinterpret_cast<LRUHandle*>(handle);
    shard_[Shard(h->hash)].Release(handle);
  }